

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_Edition2024DefaultVisibilityFromOther_Test::TestBody
          (ValidationErrorTest_Edition2024DefaultVisibilityFromOther_Test *this)

{
  string_view expected_errors;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  string_view file_text;
  string_view file_text_00;
  string_view file_text_01;
  
  file_name._M_str = "vis.proto";
  file_name._M_len = 9;
  file_text._M_str =
       "\n        edition = \"2024\";\n        package vis.test;\n\n        message TopLevelMessage {\n          message NestedMessage {\n          }\n        }\n        "
  ;
  file_text._M_len = 0x98;
  ValidationErrorTest::ParseAndBuildFile(&this->super_ValidationErrorTest,file_name,file_text);
  file_name_00._M_str = "good_importer.proto";
  file_name_00._M_len = 0x13;
  file_text_00._M_str =
       "\n        edition = \"2024\";\n        import \"vis.proto\";\n\n        message GoodImport {\n          vis.test.TopLevelMessage foo = 1;\n        }\n        "
  ;
  file_text_00._M_len = 0x93;
  ValidationErrorTest::ParseAndBuildFile(&this->super_ValidationErrorTest,file_name_00,file_text_00)
  ;
  expected_errors._M_str =
       "bad_importer.proto: BadImport.foo: TYPE: Symbol \"vis.test.TopLevelMessage.NestedMessage\", defined in \"vis.proto\"  is not visible from \"bad_importer.proto\". It defaulted to local from file-level \'option features.default_symbol_visibility = \'EXPORT_TOP_LEVEL\'; and cannot be accessed outside its own file\n"
  ;
  expected_errors._M_len = 0x12f;
  file_name_01._M_str = "bad_importer.proto";
  file_name_01._M_len = 0x12;
  file_text_01._M_str =
       "\n        edition = \"2024\";\n        import \"vis.proto\";\n\n        message BadImport {\n          vis.test.TopLevelMessage.NestedMessage foo = 1;\n        }\n        "
  ;
  file_text_01._M_len = 0xa0;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            (&this->super_ValidationErrorTest,file_name_01,file_text_01,expected_errors);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, Edition2024DefaultVisibilityFromOther) {
  ParseAndBuildFile("vis.proto", R"schema(
        edition = "2024";
        package vis.test;

        message TopLevelMessage {
          message NestedMessage {
          }
        }
        )schema");

  ParseAndBuildFile("good_importer.proto", R"schema(
        edition = "2024";
        import "vis.proto";

        message GoodImport {
          vis.test.TopLevelMessage foo = 1;
        }
        )schema");

  ParseAndBuildFileWithErrorSubstr(
      "bad_importer.proto", R"schema(
        edition = "2024";
        import "vis.proto";

        message BadImport {
          vis.test.TopLevelMessage.NestedMessage foo = 1;
        }
        )schema",

      "bad_importer.proto: BadImport.foo: TYPE: Symbol "
      "\"vis.test.TopLevelMessage.NestedMessage\", defined in \"vis.proto\"  "
      "is not visible from \"bad_importer.proto\". It defaulted to local from "
      "file-level 'option features.default_symbol_visibility = "
      "'EXPORT_TOP_LEVEL'; and cannot be accessed outside its own file\n");
}